

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ClosePopupsExceptModals(void)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ImGui *this;
  
  uVar1 = (GImGui->OpenPopupStack).Size;
  uVar3 = (ulong)(int)uVar1;
  this = (ImGui *)(ulong)((int)uVar1 >> 0x1f & uVar1);
  lVar4 = uVar3 * 0x38 + -0x30;
  do {
    if ((long)uVar3 < 1) goto LAB_00190507;
    lVar2 = *(long *)((long)&((GImGui->OpenPopupStack).Data)->PopupId + lVar4);
    if (lVar2 == 0) goto LAB_00190505;
    uVar3 = uVar3 - 1;
    lVar4 = lVar4 + -0x38;
  } while ((*(byte *)(lVar2 + 0x17) & 8) == 0);
  uVar3 = (ulong)((int)uVar3 + 1);
LAB_00190505:
  this = (ImGui *)(uVar3 & 0xffffffff);
LAB_00190507:
  if ((int)this < (int)uVar1) {
    ClosePopupToLevel(this,1,SUB81(uVar3,0));
    return;
  }
  return;
}

Assistant:

void ImGui::ClosePopupsExceptModals()
{
    ImGuiContext& g = *GImGui;

    int popup_count_to_keep;
    for (popup_count_to_keep = g.OpenPopupStack.Size; popup_count_to_keep > 0; popup_count_to_keep--)
    {
        ImGuiWindow* window = g.OpenPopupStack[popup_count_to_keep - 1].Window;
        if (!window || (window->Flags & ImGuiWindowFlags_Modal))
            break;
    }
    if (popup_count_to_keep < g.OpenPopupStack.Size) // This test is not required but it allows to set a convenient breakpoint on the statement below
        ClosePopupToLevel(popup_count_to_keep, true);
}